

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  bool will_have_scrollbar_y;
  bool will_have_scrollbar_x;
  float local_8c;
  float fStack_88;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImVec2 local_48;
  ImVec2 size_desired;
  ImVec2 size_pad;
  ImVec2 size_decorations;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *size_contents_local;
  ImGuiWindow *window_local;
  ImVec2 size_auto_fit;
  
  pIVar1 = GImGui;
  fVar4 = ImGuiWindow::TitleBarHeight(window);
  fVar5 = ImGuiWindow::MenuBarHeight(window);
  ImVec2::ImVec2(&size_pad,0.0,fVar4 + fVar5);
  size_desired = operator*(&window->WindowPadding,2.0);
  register0x00001200 = operator+(size_contents,&size_desired);
  local_48 = operator+((ImVec2 *)&size_min.y,&size_pad);
  window_local = (ImGuiWindow *)local_48;
  if ((window->Flags & 0x2000000U) == 0) {
    size_min.x._3_1_ = (window->Flags & 0x4000000U) != 0;
    size_min.x._2_1_ = (window->Flags & 0x10000000U) != 0;
    local_5c = (pIVar1->Style).WindowMinSize;
    if (((bool)size_min.x._3_1_) || ((bool)size_min.x._2_1_)) {
      ImVec2::ImVec2(&local_6c,4.0,4.0);
      local_64 = ImMin(&local_5c,&local_6c);
      local_5c = local_64;
    }
    size_auto_fit_after_constraint = operator*(&(pIVar1->Style).DisplaySafeAreaPadding,2.0);
    local_7c = operator-(&(pIVar1->IO).DisplaySize,&size_auto_fit_after_constraint);
    local_74 = ImMax(&local_5c,&local_7c);
    window_local = (ImGuiWindow *)ImClamp(&local_48,&local_5c,local_74);
    IVar6 = CalcSizeAfterConstraint(window,(ImVec2)window_local);
    local_8c = IVar6.x;
    if (((size_contents->x <= (local_8c - size_desired.x) - size_pad.x) ||
        ((window->Flags & 8U) != 0)) || (bVar2 = true, (window->Flags & 0x800U) == 0)) {
      bVar2 = (window->Flags & 0x8000U) != 0;
    }
    fStack_88 = IVar6.y;
    if ((size_contents->y <= (fStack_88 - size_desired.y) - size_pad.y) ||
       (bVar3 = true, (window->Flags & 8U) != 0)) {
      bVar3 = (window->Flags & 0x4000U) != 0;
    }
    if (bVar2) {
      window_local = (ImGuiWindow *)
                     CONCAT44((pIVar1->Style).ScrollbarSize + window_local._4_4_,window_local._0_4_)
      ;
    }
    if (bVar3) {
      window_local = (ImGuiWindow *)
                     CONCAT44(window_local._4_4_,(pIVar1->Style).ScrollbarSize + window_local._0_4_)
      ;
    }
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}